

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O1

bool __thiscall despot::Pocman::HearGhost(Pocman *this,PocmanState *pocstate)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  
  bVar2 = 0 < this->num_ghosts_;
  if ((0 < this->num_ghosts_) &&
     (iVar1 = despot::Coord::ManhattanDistance
                        (*(undefined8 *)
                          (pocstate->ghost_pos).
                          super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
                          super__Vector_impl_data._M_start,*(undefined8 *)&pocstate->pocman_pos),
     this->hear_range_ < iVar1)) {
    lVar3 = 1;
    do {
      bVar2 = lVar3 < this->num_ghosts_;
      if (this->num_ghosts_ <= lVar3) {
        return bVar2;
      }
      iVar1 = despot::Coord::ManhattanDistance
                        (*(undefined8 *)
                          ((pocstate->ghost_pos).
                           super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl
                           .super__Vector_impl_data._M_start + lVar3 * 8),
                         *(undefined8 *)&pocstate->pocman_pos);
      lVar3 = lVar3 + 1;
    } while (this->hear_range_ < iVar1);
  }
  return bVar2;
}

Assistant:

bool Pocman::HearGhost(const PocmanState& pocstate) const {
	for (int g = 0; g < num_ghosts_; g++)
		if (Coord::ManhattanDistance(pocstate.ghost_pos[g], pocstate.pocman_pos)
			<= hear_range_)
			return true;
	return false;
}